

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

char * stbi_zlib_decode_noheader_malloc(char *buffer,int len,int *outlen)

{
  int iVar1;
  char *obuf;
  stbi__zbuf a;
  stbi__zbuf local_1018;
  
  obuf = (char *)malloc(0x4000);
  if (obuf != (char *)0x0) {
    local_1018.zbuffer_end = (stbi_uc *)(buffer + len);
    local_1018.zbuffer = (stbi_uc *)buffer;
    iVar1 = stbi__do_zlib(&local_1018,obuf,0x4000,1,0);
    if (iVar1 != 0) {
      if (outlen != (int *)0x0) {
        *outlen = (int)local_1018.zout - (int)local_1018.zout_start;
      }
      return (char *)CONCAT44(local_1018.zout_start._4_4_,(int)local_1018.zout_start);
    }
    free((void *)CONCAT44(local_1018.zout_start._4_4_,(int)local_1018.zout_start));
  }
  return (char *)0x0;
}

Assistant:

STBIDEF char *stbi_zlib_decode_noheader_malloc(char const *buffer, int len, int *outlen)
{
    stbi__zbuf a;
    char *p = (char *) stbi__malloc(16384);
    if (p == NULL) return NULL;
    a.zbuffer = (stbi_uc *) buffer;
    a.zbuffer_end = (stbi_uc *) buffer + len;
    if (stbi__do_zlib(&a, p, 16384, 1, 0))
    {
        if (outlen) *outlen = (int) (a.zout - a.zout_start);
        return a.zout_start;
    } else
    {
        STBI_FREE(a.zout_start);
        return NULL;
    }
}